

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketAcceptorTestCase.cpp
# Opt level: O2

void __thiscall
SuiteSocketAcceptorTests::receivePartialMessageFixture::receivePartialMessageFixture
          (receivePartialMessageFixture *this)

{
  socket_handle sVar1;
  SocketAcceptor *this_00;
  string input;
  SessionSettings settings;
  stringstream stream;
  
  (this->application).super_NullApplication.super_Application._vptr_Application =
       (_func_int **)&PTR__Application_0032a608;
  *(code **)&this->factory = FIX::SocketServer::accept;
  FIX::SessionSettings::SessionSettings(&settings);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&input,
             "[DEFAULT]\nConnectionType=acceptor\nSocketAcceptPort=5000\nSocketReuseAddress=Y\nSendBufferSize=1024\nReceiveBufferSize=1024\nStartTime=00:00:00\nEndTime=00:00:00\nUseDataDictionary=N\nCheckLatency=N\n[SESSION]\nBeginString=FIX.4.2\nSenderCompID=ISLD\nTargetCompID=TW\n[SESSION]\nBeginString=FIX.4.1\nSenderCompID=ISLD\nTargetCompID=WT\n"
             ,(allocator<char> *)&stream);
  std::__cxx11::stringstream::stringstream((stringstream *)&stream,(string *)&input,_S_out|_S_in);
  FIX::operator>>((istream *)&stream,&settings);
  this_00 = (SocketAcceptor *)operator_new(0x1a0);
  FIX::SocketAcceptor::SocketAcceptor
            (this_00,(Application *)this,(MessageStoreFactory *)&this->factory,&settings);
  this->object = this_00;
  FIX::Acceptor::poll(0.0);
  sVar1 = FIX::createSocket(5000,"127.0.0.1");
  this->s = sVar1;
  FIX::Acceptor::poll(0.0);
  std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
  std::__cxx11::string::~string((string *)&input);
  FIX::SessionSettings::~SessionSettings(&settings);
  return;
}

Assistant:

receivePartialMessageFixture()
  {
    SessionSettings settings;
    std::string input =
      "[DEFAULT]\n"
      "ConnectionType=acceptor\n"
      "SocketAcceptPort=5000\n"
      "SocketReuseAddress=Y\n"
      "SendBufferSize=1024\n"
      "ReceiveBufferSize=1024\n"
      "StartTime=00:00:00\n"
      "EndTime=00:00:00\n"
      "UseDataDictionary=N\n"
      "CheckLatency=N\n"
      "[SESSION]\n"
      "BeginString=FIX.4.2\n"
      "SenderCompID=ISLD\n"
      "TargetCompID=TW\n"
      "[SESSION]\n"
      "BeginString=FIX.4.1\n"
      "SenderCompID=ISLD\n"
      "TargetCompID=WT\n";
    std::stringstream stream( input );
    stream >> settings;

    object = new SocketAcceptor( application, factory, settings );
    object->poll();
    s = createSocket( 5000, "127.0.0.1" );
    object->poll();
  }